

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

ByteData256 * __thiscall
cfd::TransactionContext::CreateSignatureHashByTaproot
          (ByteData256 *__return_storage_ptr__,TransactionContext *this,OutPoint *outpoint,
          SigHashType *sighash_type,ByteData256 *tap_leaf_hash,uint32_t *code_separator_position,
          ByteData *annex)

{
  ByteData256 *pBVar1;
  ByteData256 *__x;
  bool bVar2;
  uint uVar3;
  undefined4 uVar4;
  CfdException *this_00;
  ByteData256 *this_01;
  ulong uVar5;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxos;
  ByteData annex_data;
  TapScriptData script_data;
  UtxoData utxo;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> local_5e8;
  SigHashType *local_5c8;
  ByteData256 *local_5c0;
  ByteData256 *local_5b8;
  OutPoint *local_5b0;
  OutPoint local_5a8;
  undefined1 local_580 [84];
  SigHashType local_52c [12];
  UtxoData local_520;
  
  local_5c8 = sighash_type;
  local_5c0 = __return_storage_ptr__;
  local_5b8 = tap_leaf_hash;
  local_5b0 = outpoint;
  UtxoData::UtxoData(&local_520);
  local_5e8.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e8.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(long *)&this->field_0x18 != *(long *)&this->field_0x10) {
    uVar5 = 0;
    do {
      cfd::core::AbstractTxIn::GetTxid();
      uVar3 = cfd::core::AbstractTxIn::GetVout();
      cfd::core::OutPoint::OutPoint(&local_5a8,(Txid *)local_580,uVar3);
      local_580._0_8_ = &PTR__Txid_002b2f00;
      if ((pointer)local_580._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_580._8_8_);
      }
      bVar2 = IsFindUtxoMap(this,&local_5a8,&local_520);
      if (!bVar2) {
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        local_580._0_8_ = local_580 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_580,"Utxo is not found. CreateSignatureHashByTaproot fail.","");
        core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_580);
        __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      GetLockingScriptFromUtxoData((Script *)local_580,&local_520);
      cfd::core::Script::operator=(&local_520.locking_script,(Script *)local_580);
      core::Script::~Script((Script *)local_580);
      cfd::core::TxOut::TxOut((TxOut *)local_580,&local_520.amount,&local_520.locking_script);
      std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::
      emplace_back<cfd::core::TxOut>(&local_5e8,(TxOut *)local_580);
      local_580._0_8_ = cfd::core::ExtPrivkey::IsValid;
      core::Script::~Script((Script *)(local_580 + 0x18));
      local_5a8.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b2f00;
      if (local_5a8.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5a8.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((*(long *)&this->field_0x18 - *(long *)&this->field_0x10 >> 4) *
                            -0x71c71c71c71c71c7));
  }
  uVar4 = (**(code **)(*(long *)this + 0x78))(this,local_5b0);
  cfd::core::ByteData::ByteData((ByteData *)&local_5a8);
  __x = local_5b8;
  if (annex != (ByteData *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a8,&annex->data_);
  }
  this_01 = (ByteData256 *)local_580;
  cfd::core::ByteData256::ByteData256(this_01);
  pBVar1 = local_5c0;
  local_580._24_4_ = 0xffffffff;
  if (__x != (ByteData256 *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_580,&__x->data_);
    if (code_separator_position != (uint32_t *)0x0) {
      local_580._24_4_ = *code_separator_position;
    }
  }
  cfd::core::SigHashType::SigHashType(local_52c,local_5c8);
  if (__x == (ByteData256 *)0x0) {
    this_01 = (ByteData256 *)0x0;
  }
  cfd::core::Transaction::GetSchnorrSignatureHash
            (pBVar1,this,uVar4,local_52c,&local_5e8,this_01,&local_5a8);
  if ((_func_int **)local_580._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_580._0_8_);
  }
  if (local_5a8.txid_._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_5a8.txid_._vptr_Txid);
  }
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&local_5e8);
  UtxoData::~UtxoData(&local_520);
  return pBVar1;
}

Assistant:

ByteData256 TransactionContext::CreateSignatureHashByTaproot(
    const OutPoint& outpoint, const SigHashType& sighash_type,
    const ByteData256* tap_leaf_hash, const uint32_t* code_separator_position,
    const ByteData* annex) const {
  UtxoData utxo;
  std::vector<TxOut> utxos;
  // utxos.reserve(vin_.size());
  // for (const auto& txin_ref : vin_) {
  for (size_t index = 0; index < vin_.size(); ++index) {
    const auto& txin_ref = vin_[index];
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(target_outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. CreateSignatureHashByTaproot fail.");
    }
    utxo.locking_script = GetLockingScriptFromUtxoData(utxo);
    utxos.emplace_back(TxOut(utxo.amount, utxo.locking_script));
  }

  uint32_t txin_index = GetTxInIndex(outpoint);
  ByteData annex_data;
  if (annex != nullptr) annex_data = *annex;
  TapScriptData script_data;
  if (tap_leaf_hash != nullptr) {
    script_data.tap_leaf_hash = *tap_leaf_hash;
    if (code_separator_position != nullptr) {
      script_data.code_separator_position = *code_separator_position;
    }
  }

  return GetSchnorrSignatureHash(
      txin_index, sighash_type, utxos,
      (tap_leaf_hash != nullptr) ? &script_data : nullptr, annex_data);
}